

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_spline::SetClosed(ChFunctionRotation_spline *this,bool mc)

{
  ChVectorDynamic<> *pCVar1;
  long lVar2;
  double *pdVar3;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  size_type sVar4;
  ulong uVar5;
  
  if (this->closed == mc) {
    return;
  }
  if (mc) {
    sVar4 = (long)this->p +
            ((long)(this->rotations).
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rotations).
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
    resize(&this->rotations,sVar4);
    pCVar1 = &this->knots;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->p + 1 + sVar4);
    lVar2 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (lVar2 < 0) goto LAB_008bf76d;
    if (lVar2 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar2 << 3);
    }
    geometry::ChBasisToolsBspline::ComputeKnotUniform(pCVar1,this->p,0.0,1.0);
    lVar2 = (long)this->p;
    if (0 < lVar2) {
      uVar5 = sVar4 - lVar2;
      pdVar3 = ((this->rotations).
                super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_data + 3;
      do {
        if ((uVar5 & 0x7ffffffffffffff) != 0) {
          pdVar3[uVar5 * 4 + -3] = ((ChQuaternion<double> *)(pdVar3 + -3))->m_data[0];
          pdVar3[uVar5 * 4 + -2] = pdVar3[-2];
          pdVar3[uVar5 * 4 + -1] = pdVar3[-1];
          pdVar3[uVar5 * 4] = *pdVar3;
        }
        pdVar3 = pdVar3 + 4;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    if (mc) goto LAB_008bf75f;
  }
  sVar4 = ((long)(this->rotations).
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->rotations).
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) - (long)this->p;
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::resize
            (&this->rotations,sVar4);
  pCVar1 = &this->knots;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->p + 1 + sVar4);
  lVar2 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (-1 < lVar2) {
    if (lVar2 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar2 << 3);
    }
    geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p,0.0,1.0);
LAB_008bf75f:
    this->closed = mc;
    return;
  }
LAB_008bf76d:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChFunctionRotation_spline::SetClosed(bool mc) {
	if (this->closed == mc)
		return;

	// switch open->closed
	if (mc == true) {
		// add p control points to be wrapped: resize knots and control points
		auto n = this->rotations.size();
		n += p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);
		
		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, p);
		
		// wrap last control points
		for (int i = 0; i < p; ++i)
			this->rotations[n - p + i] = this->rotations[i];
	}
	
	// switch closed->open
	if (mc == false) {
		// remove p control points that was wrapped: resize knots and control points
		auto n = this->rotations.size();
		n -= p; 
		this->rotations.resize(n);
		this->knots.setZero(n + p + 1);

		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
	}

	this->closed = mc;
}